

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O2

void __thiscall server::ctfservmode::died(ctfservmode *this,clientinfo *ci,clientinfo *actor)

{
  uint uVar1;
  flag *pfVar2;
  int iVar3;
  ulong uVar4;
  clientinfo *dropper;
  int i;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  if (this->notgotflags != false) {
    return;
  }
  if ((gamemode + 3U < 0x1a) && ((0x4c0000UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) != 0)) {
    lVar7 = 0x34;
    for (lVar6 = 0; lVar6 < (this->flags).ulen; lVar6 = lVar6 + 1) {
      if (*(int *)((long)&((this->flags).buf)->id + lVar7) == ci->clientnum) {
        deadflag(this,(int)lVar6);
      }
      lVar7 = lVar7 + 0x44;
    }
  }
  uVar5 = 0;
  if (actor != (clientinfo *)0x0) {
    dropper = (clientinfo *)0x0;
    if (ctftkpenalty == 0) goto LAB_00145209;
    if ((gamemode + 3U < 0x1a && actor != ci) &&
       ((0x55fUL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) == 0)) {
      iVar3 = strcmp(actor->team,ci->team);
      dropper = (clientinfo *)0x0;
      if (iVar3 == 0) {
        dropper = actor;
      }
      goto LAB_00145209;
    }
  }
  dropper = (clientinfo *)0x0;
LAB_00145209:
  dropflag(this,ci,dropper);
  uVar1 = (this->flags).ulen;
  pfVar2 = (this->flags).buf;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 * 0x44 - uVar5 != 0; uVar5 = uVar5 + 0x44) {
    if (*(int *)((long)&pfVar2->dropper + uVar5) == ci->clientnum) {
      *(undefined8 *)((long)&pfVar2->dropcount + uVar5) = 0xffffffff00000000;
    }
  }
  return;
}

Assistant:

void died(clientinfo *ci, clientinfo *actor)
    {
        if(notgotflags) return;
        if(m_hold) loopv(flags) if(flags[i].owner==ci->clientnum) deadflag(i);
        dropflag(ci, ctftkpenalty && actor && actor != ci && isteam(actor->team, ci->team) ? actor : NULL);
        loopv(flags) if(flags[i].dropper == ci->clientnum) { flags[i].dropper = -1; flags[i].dropcount = 0; }
    }